

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftpcommon.c
# Opt level: O2

void list_directory_from_sftp_feed(list_directory_from_sftp_ctx *ctx,fxp_name *name)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  fxp_name **ppfVar4;
  fxp_name *pfVar5;
  size_t i;
  ulong uVar6;
  
  if (ctx->sorting == true) {
    sVar2 = strlen(name->filename);
    sVar3 = strlen(name->longname);
    uVar6 = sVar2 + sVar3 + 0x50;
    if (uVar6 <= 0x800000 - ctx->total_memory) {
      ppfVar4 = (fxp_name **)safegrowarray(ctx->names,&ctx->namesize,8,ctx->nnames,1,false);
      ctx->names = ppfVar4;
      pfVar5 = fxp_dup_name(name);
      sVar1 = ctx->nnames;
      ctx->nnames = sVar1 + 1;
      ctx->names[sVar1] = pfVar5;
      ctx->total_memory = ctx->total_memory + uVar6;
      return;
    }
    list_directory_from_sftp_warn_unsorted();
    for (uVar6 = 0; uVar6 < ctx->nnames; uVar6 = uVar6 + 1) {
      list_directory_from_sftp_print(ctx->names[uVar6]);
      fxp_free_name(ctx->names[uVar6]);
    }
    safefree(ctx->names);
    ctx->names = (fxp_name **)0x0;
    ctx->sorting = false;
    ctx->nnames = 0;
    ctx->namesize = 0;
  }
  list_directory_from_sftp_print(name);
  return;
}

Assistant:

void list_directory_from_sftp_feed(struct list_directory_from_sftp_ctx *ctx,
                                   struct fxp_name *name)
{
    if (ctx->sorting) {
        /*
         * Accumulate these filenames into an array that we'll sort -
         * unless the array gets _really_ big, in which case, to avoid
         * consuming all the client's memory, we fall back to
         * outputting the directory listing unsorted.
         */
        size_t this_name_memory =
            sizeof(*ctx->names) + sizeof(**ctx->names) +
            strlen(name->filename) +
            strlen(name->longname);

        if (MAX_NAMES_MEMORY - ctx->total_memory < this_name_memory) {
            list_directory_from_sftp_warn_unsorted();

            /* Output all the previously stored names. */
            for (size_t i = 0; i < ctx->nnames; i++) {
                list_directory_from_sftp_print(ctx->names[i]);
                fxp_free_name(ctx->names[i]);
            }

            /* Don't store further names in that array. */
            sfree(ctx->names);
            ctx->names = NULL;
            ctx->nnames = 0;
            ctx->namesize = 0;
            ctx->sorting = false;

            /* And don't forget to output the name passed in this
             * actual function call. */
            list_directory_from_sftp_print(name);
        } else {
            sgrowarray(ctx->names, ctx->namesize, ctx->nnames);
            ctx->names[ctx->nnames++] = fxp_dup_name(name);
            ctx->total_memory += this_name_memory;
        }
    } else {
        list_directory_from_sftp_print(name);
    }
}